

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylehelper.cpp
# Opt level: O2

int QStyleHelper::calcBigLineSize(int radius)

{
  int iVar1;
  int iVar2;
  
  iVar1 = radius / 6;
  if (iVar1 < 5) {
    iVar1 = 4;
  }
  iVar2 = radius / 2;
  if (iVar1 < radius / 2) {
    iVar2 = iVar1;
  }
  return iVar2;
}

Assistant:

int calcBigLineSize(int radius)
{
    int bigLineSize = radius / 6;
    if (bigLineSize < 4)
        bigLineSize = 4;
    if (bigLineSize > radius / 2)
        bigLineSize = radius / 2;
    return bigLineSize;
}